

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

string * __thiscall
cmMakefile::GetModulesFile
          (string *__return_storage_ptr__,cmMakefile *this,string *filename,bool *system)

{
  bool bVar1;
  PolicyStatus PVar2;
  char *pcVar3;
  reference pbVar4;
  string *psVar5;
  ulong uVar6;
  ostream *poVar7;
  PolicyID id;
  bool local_3c9;
  string local_360;
  string local_340;
  undefined1 local_320 [8];
  ostringstream e;
  allocator<char> local_1a1;
  string local_1a0;
  undefined1 local_180 [8];
  string mods;
  string local_158;
  char *local_138;
  char *currentFile;
  undefined1 local_128 [8];
  string itempl;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string local_e8;
  undefined1 local_c8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  modulePath;
  allocator<char> local_99;
  string local_98;
  char *local_78;
  char *cmakeModulePath;
  string moduleInCMakeModulePath;
  string moduleInCMakeRoot;
  bool *system_local;
  string *filename_local;
  cmMakefile *this_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::string((string *)(moduleInCMakeModulePath.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&cmakeModulePath);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"CMAKE_MODULE_PATH",&local_99);
  pcVar3 = GetDefinition(this,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  local_78 = pcVar3;
  if (pcVar3 != (char *)0x0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_c8);
    pcVar3 = local_78;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e8,pcVar3,(allocator<char> *)((long)&__range2 + 7));
    cmSystemTools::ExpandListArgument
              (&local_e8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_c8,false);
    std::__cxx11::string::~string((string *)&local_e8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_c8);
    itempl.field_2._8_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_c8);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)((long)&itempl.field_2 + 8)), bVar1) {
      pbVar4 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end2);
      std::__cxx11::string::string((string *)local_128,(string *)pbVar4);
      cmsys::SystemTools::ConvertToUnixSlashes((string *)local_128);
      std::__cxx11::string::operator+=((string *)local_128,"/");
      std::__cxx11::string::operator+=((string *)local_128,(string *)filename);
      bVar1 = cmsys::SystemTools::FileExists((string *)local_128);
      if (bVar1) {
        std::__cxx11::string::operator=((string *)&cmakeModulePath,(string *)local_128);
        currentFile._4_4_ = 2;
      }
      else {
        currentFile._4_4_ = 0;
      }
      std::__cxx11::string::~string((string *)local_128);
      if (currentFile._4_4_ != 0) break;
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_c8);
  }
  psVar5 = cmSystemTools::GetCMakeRoot_abi_cxx11_();
  std::__cxx11::string::operator=
            ((string *)(moduleInCMakeModulePath.field_2._M_local_buf + 8),(string *)psVar5);
  std::__cxx11::string::operator+=
            ((string *)(moduleInCMakeModulePath.field_2._M_local_buf + 8),"/Modules/");
  std::__cxx11::string::operator+=
            ((string *)(moduleInCMakeModulePath.field_2._M_local_buf + 8),(string *)filename);
  cmsys::SystemTools::ConvertToUnixSlashes((string *)((long)&moduleInCMakeModulePath.field_2 + 8));
  bVar1 = cmsys::SystemTools::FileExists((string *)((long)&moduleInCMakeModulePath.field_2 + 8));
  if (!bVar1) {
    std::__cxx11::string::clear();
  }
  *system = false;
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&cmakeModulePath);
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) != 0) {
    *system = true;
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,
               (string *)(moduleInCMakeModulePath.field_2._M_local_buf + 8));
  }
  uVar6 = std::__cxx11::string::empty();
  if (((uVar6 & 1) != 0) || (uVar6 = std::__cxx11::string::empty(), (uVar6 & 1) != 0))
  goto LAB_0015eff1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"CMAKE_CURRENT_LIST_FILE",
             (allocator<char> *)(mods.field_2._M_local_buf + 0xf));
  pcVar3 = GetDefinition(this,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator((allocator<char> *)(mods.field_2._M_local_buf + 0xf));
  local_138 = pcVar3;
  psVar5 = cmSystemTools::GetCMakeRoot_abi_cxx11_();
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180,
                 psVar5,"/Modules/");
  pcVar3 = local_138;
  local_3c9 = false;
  if (local_138 != (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a0,pcVar3,&local_1a1);
    local_3c9 = cmsys::SystemTools::IsSubDirectory(&local_1a0,(string *)local_180);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::allocator<char>::~allocator(&local_1a1);
  }
  if (local_3c9 != false) {
    PVar2 = GetPolicyStatus(this,CMP0017,false);
    if (PVar2 != OLD) {
      if (PVar2 != WARN) {
        if (PVar2 - NEW < 3) {
          *system = true;
          std::__cxx11::string::operator=
                    ((string *)__return_storage_ptr__,
                     (string *)(moduleInCMakeModulePath.field_2._M_local_buf + 8));
        }
        goto LAB_0015efd5;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
      poVar7 = std::operator<<((ostream *)local_320,"File ");
      poVar7 = std::operator<<(poVar7,local_138);
      poVar7 = std::operator<<(poVar7," includes ");
      poVar7 = std::operator<<(poVar7,(string *)&cmakeModulePath);
      poVar7 = std::operator<<(poVar7," (found via CMAKE_MODULE_PATH) which shadows ");
      poVar7 = std::operator<<(poVar7,(string *)(moduleInCMakeModulePath.field_2._M_local_buf + 8));
      poVar7 = std::operator<<(poVar7,". This may cause errors later on .\n");
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_340,(cmPolicies *)0x11,id);
      std::operator<<(poVar7,(string *)&local_340);
      std::__cxx11::string::~string((string *)&local_340);
      std::__cxx11::ostringstream::str();
      IssueMessage(this,AUTHOR_WARNING,&local_360);
      std::__cxx11::string::~string((string *)&local_360);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
    }
    *system = false;
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&cmakeModulePath);
  }
LAB_0015efd5:
  std::__cxx11::string::~string((string *)local_180);
LAB_0015eff1:
  currentFile._4_4_ = 1;
  std::__cxx11::string::~string((string *)&cmakeModulePath);
  std::__cxx11::string::~string((string *)(moduleInCMakeModulePath.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string cmMakefile::GetModulesFile(const std::string& filename,
                                       bool& system) const
{
  std::string result;

  // We search the module always in CMAKE_ROOT and in CMAKE_MODULE_PATH,
  // and then decide based on the policy setting which one to return.
  // See CMP0017 for more details.
  // The specific problem was that KDE 4.5.0 installs a
  // FindPackageHandleStandardArgs.cmake which doesn't have the new features
  // of FPHSA.cmake introduced in CMake 2.8.3 yet, and by setting
  // CMAKE_MODULE_PATH also e.g. FindZLIB.cmake from cmake included
  // FPHSA.cmake from kdelibs and not from CMake, and tried to use the
  // new features, which were not there in the version from kdelibs, and so
  // failed ("
  std::string moduleInCMakeRoot;
  std::string moduleInCMakeModulePath;

  // Always search in CMAKE_MODULE_PATH:
  const char* cmakeModulePath = this->GetDefinition("CMAKE_MODULE_PATH");
  if (cmakeModulePath) {
    std::vector<std::string> modulePath;
    cmSystemTools::ExpandListArgument(cmakeModulePath, modulePath);

    // Look through the possible module directories.
    for (std::string itempl : modulePath) {
      cmSystemTools::ConvertToUnixSlashes(itempl);
      itempl += "/";
      itempl += filename;
      if (cmSystemTools::FileExists(itempl)) {
        moduleInCMakeModulePath = itempl;
        break;
      }
    }
  }

  // Always search in the standard modules location.
  moduleInCMakeRoot = cmSystemTools::GetCMakeRoot();
  moduleInCMakeRoot += "/Modules/";
  moduleInCMakeRoot += filename;
  cmSystemTools::ConvertToUnixSlashes(moduleInCMakeRoot);
  if (!cmSystemTools::FileExists(moduleInCMakeRoot)) {
    moduleInCMakeRoot.clear();
  }

  // Normally, prefer the files found in CMAKE_MODULE_PATH. Only when the file
  // from which we are being called is located itself in CMAKE_ROOT, then
  // prefer results from CMAKE_ROOT depending on the policy setting.
  system = false;
  result = moduleInCMakeModulePath;
  if (result.empty()) {
    system = true;
    result = moduleInCMakeRoot;
  }

  if (!moduleInCMakeModulePath.empty() && !moduleInCMakeRoot.empty()) {
    const char* currentFile = this->GetDefinition("CMAKE_CURRENT_LIST_FILE");
    std::string mods = cmSystemTools::GetCMakeRoot() + "/Modules/";
    if (currentFile && cmSystemTools::IsSubDirectory(currentFile, mods)) {
      switch (this->GetPolicyStatus(cmPolicies::CMP0017)) {
        case cmPolicies::WARN: {
          std::ostringstream e;
          /* clang-format off */
          e << "File " << currentFile << " includes "
            << moduleInCMakeModulePath
            << " (found via CMAKE_MODULE_PATH) which shadows "
            << moduleInCMakeRoot  << ". This may cause errors later on .\n"
            << cmPolicies::GetPolicyWarning(cmPolicies::CMP0017);
          /* clang-format on */

          this->IssueMessage(MessageType::AUTHOR_WARNING, e.str());
          CM_FALLTHROUGH;
        }
        case cmPolicies::OLD:
          system = false;
          result = moduleInCMakeModulePath;
          break;
        case cmPolicies::REQUIRED_IF_USED:
        case cmPolicies::REQUIRED_ALWAYS:
        case cmPolicies::NEW:
          system = true;
          result = moduleInCMakeRoot;
          break;
      }
    }
  }

  return result;
}